

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::TimeZoneNamesImpl::getExemplarLocationName
          (TimeZoneNamesImpl *this,UnicodeString *tzID,UnicodeString *name)

{
  UErrorCode UVar1;
  ZNames *this_00;
  UErrorCode status;
  ConstChar16Ptr local_40;
  Mutex lock;
  
  UnicodeString::setToBogus(name);
  lock.fMutex = (UMutex *)gDataMutex;
  umtx_lock_63((UMutex *)gDataMutex);
  status = U_ZERO_ERROR;
  this_00 = loadTimeZoneNames(this,tzID,&status);
  UVar1 = status;
  Mutex::~Mutex(&lock);
  if ((this_00 != (ZNames *)0x0) && (UVar1 < U_ILLEGAL_ARGUMENT_ERROR)) {
    local_40.p_ = ZNames::getName(this_00,UTZNM_EXEMPLAR_LOCATION);
    if (local_40.p_ != (UChar *)0x0) {
      UnicodeString::setTo(name,'\x01',&local_40,-1);
    }
  }
  return name;
}

Assistant:

UnicodeString&
TimeZoneNamesImpl::getExemplarLocationName(const UnicodeString& tzID, UnicodeString& name) const {
    name.setToBogus();  // cleanup result.
    const UChar* locName = NULL;
    ZNames *tznames = NULL;
    TimeZoneNamesImpl *nonConstThis = const_cast<TimeZoneNamesImpl *>(this);

    {
        Mutex lock(&gDataMutex);
        UErrorCode status = U_ZERO_ERROR;
        tznames = nonConstThis->loadTimeZoneNames(tzID, status);
        if (U_FAILURE(status)) { return name; }
    }

    if (tznames != NULL) {
        locName = tznames->getName(UTZNM_EXEMPLAR_LOCATION);
    }
    if (locName != NULL) {
        name.setTo(TRUE, locName, -1);
    }

    return name;
}